

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

natwm_error string_to_number(char *number_string,intmax_t *dest)

{
  int *piVar1;
  intmax_t iVar2;
  undefined8 in_R9;
  undefined8 uVar3;
  intmax_t result;
  char *endptr;
  intmax_t *dest_local;
  char *number_string_local;
  
  uVar3 = 0x110d35;
  result = 0;
  endptr = (char *)dest;
  dest_local = (intmax_t *)number_string;
  piVar1 = __errno_location();
  *piVar1 = 0;
  iVar2 = strtoimax((char *)dest_local,(char **)&result,10);
  piVar1 = __errno_location();
  if (((*piVar1 == 0x22) || ((intmax_t *)result == dest_local)) || (*(char *)result != '\0')) {
    number_string_local._4_4_ = INVALID_INPUT_ERROR;
  }
  else {
    piVar1 = __errno_location();
    if (*piVar1 != 0) {
      internal_logger_long
                (natwm_logger,LEVEL_CRITICAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/cfrank[P]natwm/src/common/string.c"
                 ,0x1c3,"Unhandleable input received - Exiting...",in_R9,uVar3);
      exit(1);
    }
    *(intmax_t *)endptr = iVar2;
    number_string_local._4_4_ = NO_ERROR;
  }
  return number_string_local._4_4_;
}

Assistant:

enum natwm_error string_to_number(const char *number_string, intmax_t *dest)
{
        char *endptr = NULL;

        // Reset errno to 0 so we can test for ERANGE
        errno = 0;

        intmax_t result = strtoimax(number_string, &endptr, 10);

        if (errno == ERANGE || endptr == number_string || *endptr != '\0') {
                return INVALID_INPUT_ERROR;
        }

        if (errno != 0) {
                LOG_CRITICAL_LONG(natwm_logger, "Unhandleable input received - Exiting...");

                exit(EXIT_FAILURE);
        }

        *dest = result;

        return NO_ERROR;
}